

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTracerViewer.cpp
# Opt level: O0

void __thiscall
PathTracerViewer::Reset(PathTracerViewer *this,shared_ptr<myvk::CommandPool> *command_pool)

{
  initializer_list<VkImageMemoryBarrier> __l;
  initializer_list<VkImageMemoryBarrier> __l_00;
  int iVar1;
  element_type *peVar2;
  element_type *peVar3;
  element_type *memory_barriers;
  element_type *peVar4;
  element_type *peVar5;
  element_type *peVar6;
  undefined4 extraout_var;
  Ptr<ImageView> *in_RDI;
  shared_ptr<myvk::Fence> fence;
  shared_ptr<myvk::CommandBuffer> command_buffer;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *__r;
  shared_ptr<myvk::Image> *__r_00;
  undefined4 in_stack_fffffffffffffcf0;
  undefined4 uVar7;
  undefined4 in_stack_fffffffffffffcf4;
  undefined4 uVar8;
  undefined4 in_stack_fffffffffffffcfc;
  vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_> *in_stack_fffffffffffffd00;
  undefined8 in_stack_fffffffffffffd08;
  VkCommandBufferUsageFlags usage;
  CommandBuffer *in_stack_fffffffffffffd10;
  allocator_type *in_stack_fffffffffffffd18;
  allocator_type *__a;
  ImageBase *in_stack_fffffffffffffd20;
  ImageBase *this_01;
  undefined8 in_stack_fffffffffffffd28;
  VkImageLayout in_stack_fffffffffffffd30;
  undefined4 in_stack_fffffffffffffd34;
  vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_> *image_memory_barriers;
  uint32_t in_stack_fffffffffffffd38;
  vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_> *buffer_memory_barriers;
  undefined8 in_stack_fffffffffffffd40;
  Ptr<ImageBase> *in_stack_fffffffffffffd48;
  undefined8 uVar9;
  Ptr<ImageView> *in_stack_fffffffffffffd50;
  CommandBuffer *this_02;
  Ptr<Sampler> *in_stack_fffffffffffffd58;
  undefined8 in_stack_fffffffffffffd60;
  VkImageUsageFlags usage_00;
  DescriptorSet *this_03;
  VkFenceCreateFlags flags;
  undefined8 in_stack_fffffffffffffd68;
  VkClearColorValue *color;
  VkExtent2D *in_stack_fffffffffffffd70;
  VkCommandBufferLevel level;
  undefined4 in_stack_fffffffffffffd78;
  undefined4 in_stack_fffffffffffffd7c;
  undefined4 uVar10;
  CommandBuffer *this_04;
  vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>
  *in_stack_fffffffffffffd90;
  Ptr<ImageView> *render_pass;
  allocator<VkImageMemoryBarrier> local_229;
  undefined1 local_228 [72];
  undefined1 *local_1e0;
  undefined8 local_1d8;
  allocator_type *local_1b8;
  ImageBase *pIStack_1b0;
  undefined8 local_1a8;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined1 local_160 [23];
  vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_> local_149 [3];
  undefined1 *local_100;
  undefined8 local_f8;
  undefined8 local_d8;
  CommandBuffer *pCStack_d0;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  CommandBuffer local_98;
  DescriptorSet local_68;
  uint32_t local_28;
  uint32_t local_24;
  Fence *this_00;
  
  usage = (VkCommandBufferUsageFlags)((ulong)in_stack_fffffffffffffd08 >> 0x20);
  usage_00 = (VkImageUsageFlags)((ulong)in_stack_fffffffffffffd60 >> 0x20);
  *(undefined4 *)&(in_RDI->super___shared_ptr<myvk::ImageView,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       0;
  peVar2 = std::__shared_ptr_access<myvk::RenderPass,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<myvk::RenderPass,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x176876);
  (*(peVar2->super_DeviceObjectBase).super_Base._vptr_Base[2])();
  render_pass = in_RDI + 1;
  peVar3 = std::__shared_ptr_access<PathTracer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<PathTracer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      0x1768a3);
  local_28 = peVar3->m_width;
  peVar3 = std::__shared_ptr_access<PathTracer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<PathTracer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      0x1768bd);
  local_24 = peVar3->m_height;
  local_68.m_descriptor_pool_ptr.
  super___shared_ptr<myvk::DescriptorPool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_68.m_descriptor_set_layout_ptr.
  super___shared_ptr<myvk::DescriptorSetLayout,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_68.m_descriptor_set_layout_ptr.
  super___shared_ptr<myvk::DescriptorSetLayout,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  __r = &local_68.m_descriptor_pool_ptr.
         super___shared_ptr<myvk::DescriptorPool,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  std::vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>::vector
            ((vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_> *
             )0x1768f6);
  myvk::Image::CreateTexture2D
            ((Ptr<Device> *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
             in_stack_fffffffffffffd70,(uint32_t)((ulong)in_stack_fffffffffffffd68 >> 0x20),
             (VkFormat)in_stack_fffffffffffffd68,usage_00,in_stack_fffffffffffffd90);
  std::shared_ptr<myvk::Image>::operator=
            ((shared_ptr<myvk::Image> *)
             CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
             (shared_ptr<myvk::Image> *)__r);
  std::shared_ptr<myvk::Image>::~shared_ptr((shared_ptr<myvk::Image> *)0x17696a);
  std::vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>::~vector
            ((vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_> *
             )in_stack_fffffffffffffd00);
  std::shared_ptr<myvk::ImageBase>::shared_ptr<myvk::Image,void>
            ((shared_ptr<myvk::ImageBase> *)
             CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
             (shared_ptr<myvk::Image> *)__r);
  myvk::ImageView::Create
            (in_stack_fffffffffffffd48,(VkImageViewType)((ulong)in_stack_fffffffffffffd40 >> 0x20),
             (VkImageAspectFlags)in_stack_fffffffffffffd40);
  level = (VkCommandBufferLevel)((ulong)(in_RDI + 3) >> 0x20);
  this_03 = &local_68;
  std::shared_ptr<myvk::ImageView>::operator=
            ((shared_ptr<myvk::ImageView> *)
             CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
             (shared_ptr<myvk::ImageView> *)__r);
  std::shared_ptr<myvk::ImageView>::~shared_ptr((shared_ptr<myvk::ImageView> *)0x1769e2);
  std::shared_ptr<myvk::ImageBase>::~shared_ptr((shared_ptr<myvk::ImageBase> *)0x1769ef);
  color = (VkClearColorValue *)
          &local_98.super_DeviceObjectBase.super_Base.super_enable_shared_from_this<myvk::Base>.
           _M_weak_this.super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  myvk::Framebuffer::Create((Ptr<RenderPass> *)render_pass,in_RDI);
  std::shared_ptr<myvk::Framebuffer>::operator=
            ((shared_ptr<myvk::Framebuffer> *)
             CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
             (shared_ptr<myvk::Framebuffer> *)__r);
  uVar8 = (undefined4)((ulong)__r >> 0x20);
  std::shared_ptr<myvk::Framebuffer>::~shared_ptr((shared_ptr<myvk::Framebuffer> *)0x176a3e);
  std::__shared_ptr_access<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x176a52);
  uVar10 = 0;
  myvk::DescriptorSet::UpdateCombinedImageSampler
            (this_03,in_stack_fffffffffffffd58,in_stack_fffffffffffffd50,
             (uint32_t)((ulong)in_stack_fffffffffffffd48 >> 0x20),
             (uint32_t)in_stack_fffffffffffffd48);
  flags = (VkFenceCreateFlags)((ulong)this_03 >> 0x20);
  this_04 = &local_98;
  myvk::CommandBuffer::Create((Ptr<CommandPool> *)CONCAT44(uVar10,in_stack_fffffffffffffd78),level);
  std::__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x176aad);
  myvk::CommandBuffer::Begin(in_stack_fffffffffffffd10,usage);
  memory_barriers =
       std::__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
       operator->((__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   *)0x176ac9);
  uVar9 = 0;
  this_02 = (CommandBuffer *)0x0;
  local_b8 = 0;
  uStack_b0 = 0;
  local_a8 = 0;
  std::vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_>::vector
            ((vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_> *)0x176af7);
  local_c8 = 0;
  local_d8 = uVar9;
  pCStack_d0 = this_02;
  std::vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>::vector
            ((vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_> *)0x176b1d);
  std::__shared_ptr_access<myvk::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<myvk::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x176b2e)
  ;
  uVar7 = 0xffffffff;
  __r_00 = (shared_ptr<myvk::Image> *)CONCAT44(uVar8,7);
  myvk::ImageBase::GetMemoryBarrier
            (in_stack_fffffffffffffd20,
             (VkImageAspectFlags)((ulong)in_stack_fffffffffffffd18 >> 0x20),
             (VkAccessFlags)in_stack_fffffffffffffd18,
             (VkAccessFlags)((ulong)in_stack_fffffffffffffd10 >> 0x20),
             (VkImageLayout)in_stack_fffffffffffffd10,in_stack_fffffffffffffd30,
             in_stack_fffffffffffffd38,(uint32_t)memory_barriers);
  local_100 = (undefined1 *)
              ((long)&local_149[0].
                      super__Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>
                      ._M_impl.super__Vector_impl_data._M_start + 1);
  local_f8 = 1;
  buffer_memory_barriers = local_149;
  std::allocator<VkImageMemoryBarrier>::allocator((allocator<VkImageMemoryBarrier> *)0x176b96);
  __l._M_len._0_4_ = in_stack_fffffffffffffd30;
  __l._M_array = (iterator)in_stack_fffffffffffffd28;
  __l._M_len._4_4_ = in_stack_fffffffffffffd34;
  std::vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>::vector
            ((vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_> *)
             in_stack_fffffffffffffd20,__l,in_stack_fffffffffffffd18);
  myvk::CommandBuffer::CmdPipelineBarrier
            (this_02,(VkPipelineStageFlags)((ulong)uVar9 >> 0x20),(VkPipelineStageFlags)uVar9,
             (vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_> *)memory_barriers,
             buffer_memory_barriers,
             (vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_> *)
             CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30));
  std::vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>::~vector
            ((vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_> *)
             in_stack_fffffffffffffd00);
  std::allocator<VkImageMemoryBarrier>::~allocator((allocator<VkImageMemoryBarrier> *)local_149);
  std::vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>::~vector
            (in_stack_fffffffffffffd00);
  std::vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_>::~vector
            ((vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_> *)in_stack_fffffffffffffd00)
  ;
  peVar4 = std::__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x176c29);
  image_memory_barriers =
       (vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_> *)local_160;
  std::shared_ptr<myvk::ImageBase>::shared_ptr<myvk::Image,void>
            ((shared_ptr<myvk::ImageBase> *)CONCAT44(in_stack_fffffffffffffcf4,uVar7),__r_00);
  local_178 = 0;
  uStack_170 = 0;
  myvk::CommandBuffer::CmdClearColorImage
            (this_04,(Ptr<ImageBase> *)CONCAT44(uVar10,in_stack_fffffffffffffd78),level,color);
  std::shared_ptr<myvk::ImageBase>::~shared_ptr((shared_ptr<myvk::ImageBase> *)0x176c82);
  peVar5 = std::__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x176c8f);
  __a = (allocator_type *)0x0;
  this_01 = (ImageBase *)0x0;
  local_198 = 0;
  uStack_190 = 0;
  local_188 = 0;
  std::vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_>::vector
            ((vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_> *)0x176cbd);
  local_1a8 = 0;
  local_1b8 = __a;
  pIStack_1b0 = this_01;
  std::vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>::vector
            ((vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_> *)0x176ce3);
  std::__shared_ptr_access<myvk::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<myvk::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x176cf4)
  ;
  uVar8 = 0xffffffff;
  myvk::ImageBase::GetMemoryBarrier
            (this_01,(VkImageAspectFlags)((ulong)__a >> 0x20),(VkAccessFlags)__a,
             (VkAccessFlags)((ulong)peVar5 >> 0x20),(VkImageLayout)peVar5,
             (VkImageLayout)image_memory_barriers,(uint32_t)buffer_memory_barriers,
             (uint32_t)memory_barriers);
  local_1e0 = local_228;
  local_1d8 = 1;
  std::allocator<VkImageMemoryBarrier>::allocator((allocator<VkImageMemoryBarrier> *)0x176d5e);
  __l_00._M_len._0_4_ = (int)image_memory_barriers;
  __l_00._M_array = (iterator)peVar4;
  __l_00._M_len._4_4_ = (int)((ulong)image_memory_barriers >> 0x20);
  std::vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>::vector
            ((vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_> *)this_01,__l_00,
             __a);
  myvk::CommandBuffer::CmdPipelineBarrier
            (this_02,(VkPipelineStageFlags)((ulong)uVar9 >> 0x20),(VkPipelineStageFlags)uVar9,
             (vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_> *)memory_barriers,
             buffer_memory_barriers,image_memory_barriers);
  std::vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>::~vector
            ((vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_> *)
             in_stack_fffffffffffffd00);
  std::allocator<VkImageMemoryBarrier>::~allocator(&local_229);
  std::vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>::~vector
            (in_stack_fffffffffffffd00);
  std::vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_>::~vector
            ((vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_> *)in_stack_fffffffffffffd00)
  ;
  std::__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x176df1);
  myvk::CommandBuffer::End((CommandBuffer *)0x176df9);
  peVar6 = std::__shared_ptr_access<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x176e08);
  iVar1 = (*(peVar6->super_DeviceObjectBase).super_Base._vptr_Base[2])();
  this_00 = (Fence *)CONCAT44(extraout_var,iVar1);
  myvk::Fence::Create((Ptr<Device> *)color,flags);
  std::__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x176e3e);
  myvk::CommandBuffer::Submit(this_04,(Ptr<Fence> *)CONCAT44(uVar10,in_stack_fffffffffffffd78));
  std::__shared_ptr_access<myvk::Fence,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<myvk::Fence,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x176e5d)
  ;
  myvk::Fence::Wait(this_00,CONCAT44(in_stack_fffffffffffffcfc,uVar8));
  std::shared_ptr<myvk::Fence>::~shared_ptr((shared_ptr<myvk::Fence> *)0x176e7b);
  std::shared_ptr<myvk::CommandBuffer>::~shared_ptr((shared_ptr<myvk::CommandBuffer> *)0x176e88);
  return;
}

Assistant:

void PathTracerViewer::Reset(const std::shared_ptr<myvk::CommandPool> &command_pool) {
	m_view_type = ViewTypes::kColor;

	m_image = myvk::Image::CreateTexture2D(
	    m_gen_render_pass->GetDevicePtr(), {m_path_tracer_ptr->m_width, m_path_tracer_ptr->m_height}, 1,
	    VK_FORMAT_R8G8B8A8_UNORM,
	    VK_IMAGE_USAGE_SAMPLED_BIT | VK_IMAGE_USAGE_TRANSFER_DST_BIT | VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT);
	m_image_view = myvk::ImageView::Create(m_image, VK_IMAGE_VIEW_TYPE_2D);
	m_gen_framebuffer = myvk::Framebuffer::Create(m_gen_render_pass, m_image_view);
	m_descriptor_set->UpdateCombinedImageSampler(m_sampler, m_image_view, 0);

	std::shared_ptr<myvk::CommandBuffer> command_buffer = myvk::CommandBuffer::Create(command_pool);
	command_buffer->Begin(VK_COMMAND_BUFFER_USAGE_ONE_TIME_SUBMIT_BIT);
	command_buffer->CmdPipelineBarrier(
	    VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, {}, {},
	    {m_image->GetMemoryBarrier(VK_IMAGE_ASPECT_COLOR_BIT, 0, VK_ACCESS_TRANSFER_WRITE_BIT,
	                               VK_IMAGE_LAYOUT_UNDEFINED, VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL)});
	command_buffer->CmdClearColorImage(m_image, VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL);
	command_buffer->CmdPipelineBarrier(
	    VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_BOTTOM_OF_PIPE_BIT, {}, {},
	    {m_image->GetMemoryBarrier(VK_IMAGE_ASPECT_COLOR_BIT, VK_ACCESS_TRANSFER_WRITE_BIT, 0,
	                               VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL, VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL)});
	command_buffer->End();

	std::shared_ptr<myvk::Fence> fence = myvk::Fence::Create(command_pool->GetDevicePtr());
	command_buffer->Submit(fence);
	fence->Wait();
}